

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O1

UBool __thiscall icu_63::OlsonTimeZone::useDaylightTime(OlsonTimeZone *this)

{
  int32_t *piVar1;
  uint8_t *puVar2;
  ushort uVar3;
  int iVar4;
  int64_t iVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  UDate time;
  double dVar9;
  double dVar10;
  double dVar11;
  int32_t mid;
  int32_t doy;
  int32_t dow;
  int32_t dom;
  int32_t month;
  int32_t year;
  int32_t local_48;
  int32_t local_44;
  int32_t local_40;
  int32_t local_3c;
  int32_t local_38;
  int32_t local_34;
  
  time = uprv_getUTCtime_63();
  if ((this->finalZone != (SimpleTimeZone *)0x0) && (this->finalStartMillis <= time)) {
    iVar4 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9])
                      ();
    return (UBool)iVar4;
  }
  Grego::timeToFields(time,&local_34,&local_38,&local_3c,&local_40,&local_44,&local_48);
  bVar8 = false;
  dVar9 = Grego::fieldsToDay(local_34,0,1);
  dVar10 = Grego::fieldsToDay(local_34 + 1,0,1);
  uVar3 = this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32;
  if (0 < (short)uVar3) {
    piVar1 = this->typeOffsets;
    puVar2 = this->typeMapData;
    uVar7 = 0;
    do {
      iVar5 = transitionTimeInSeconds(this,(int16_t)uVar7);
      dVar11 = (double)iVar5;
      if (dVar10 * 86400.0 <= dVar11) {
        iVar4 = 2;
LAB_001fca2c:
        bVar8 = false;
      }
      else {
        if ((dVar9 * 86400.0 <= dVar11) && (piVar1[(ulong)puVar2[uVar7] * 2 + 1] != 0)) {
LAB_001fca27:
          iVar4 = 1;
          goto LAB_001fca2c;
        }
        if (dVar9 * 86400.0 < dVar11) {
          if (uVar7 == 0) {
            lVar6 = 1;
          }
          else {
            lVar6 = (ulong)puVar2[uVar7 - 1] * 2 + 1;
          }
          if (piVar1[lVar6] != 0) goto LAB_001fca27;
        }
        iVar4 = 0;
        bVar8 = true;
      }
      if (!bVar8) goto LAB_001fca45;
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
    iVar4 = 2;
LAB_001fca45:
    bVar8 = iVar4 != 2;
  }
  return bVar8;
}

Assistant:

UBool OlsonTimeZone::useDaylightTime() const {
    // If DST was observed in 1942 (for example) but has never been
    // observed from 1943 to the present, most clients will expect
    // this method to return FALSE.  This method determines whether
    // DST is in use in the current year (at any point in the year)
    // and returns TRUE if so.

    UDate current = uprv_getUTCtime();
    if (finalZone != NULL && current >= finalStartMillis) {
        return finalZone->useDaylightTime();
    }

    int32_t year, month, dom, dow, doy, mid;
    Grego::timeToFields(current, year, month, dom, dow, doy, mid);

    // Find start of this year, and start of next year
    double start = Grego::fieldsToDay(year, 0, 1) * SECONDS_PER_DAY;
    double limit = Grego::fieldsToDay(year+1, 0, 1) * SECONDS_PER_DAY;

    // Return TRUE if DST is observed at any time during the current
    // year.
    for (int16_t i = 0; i < transitionCount(); ++i) {
        double transition = (double)transitionTimeInSeconds(i);
        if (transition >= limit) {
            break;
        }
        if ((transition >= start && dstOffsetAt(i) != 0)
                || (transition > start && dstOffsetAt(i - 1) != 0)) {
            return TRUE;
        }
    }
    return FALSE;
}